

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_AddTxInOut_Test::TestBody
          (ConfidentialTransactionContext_AddTxInOut_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  char *in_R9;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  ConfidentialAssetId asset;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_;
  uint32_t index;
  AssertionResult gtest_ar_2;
  Address out1_addr;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  OutPoint outpoint;
  Address addr;
  ElementsConfidentialAddress ct_addr;
  ConfidentialTransactionContext txc;
  bool *in_stack_fffffffffffff228;
  undefined7 in_stack_fffffffffffff230;
  undefined1 in_stack_fffffffffffff237;
  unsigned_long *in_stack_fffffffffffff238;
  undefined7 in_stack_fffffffffffff240;
  undefined1 in_stack_fffffffffffff247;
  char *in_stack_fffffffffffff248;
  AssertHelper local_c70;
  Message local_c68;
  undefined4 local_c5c;
  AssertionResult local_c58;
  AssertHelper local_c48;
  Message local_c40;
  undefined4 local_c34;
  AssertionResult local_c30;
  AssertHelper local_c20;
  Message local_c18;
  undefined4 local_c0c;
  size_type local_c08;
  AssertionResult local_c00;
  AssertHelper local_bf0;
  Message local_be8;
  undefined4 local_bdc;
  AssertionResult local_bd8;
  string local_bc8;
  AssertHelper local_ba8;
  Message local_ba0;
  byte local_b91;
  AssertionResult local_b90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b80;
  allocator local_b61;
  string local_b60 [32];
  ConfidentialAssetId local_b40;
  _func_int **local_b18;
  undefined1 local_b10;
  ConfidentialAssetId local_b08;
  AssertionResult local_ac8;
  AssertHelper local_ab8;
  Message local_ab0;
  undefined4 local_aa4;
  undefined8 local_aa0;
  undefined1 local_a98;
  undefined8 local_a90;
  undefined1 local_a88;
  undefined8 local_a80;
  AssertionResult local_a78;
  ConfidentialAssetId local_a68;
  AssertHelper local_a40;
  Message local_a38;
  undefined4 local_a2c;
  AssertionResult local_a28;
  string local_a18;
  AssertHelper local_9f8;
  Message local_9f0;
  byte local_9e1;
  AssertionResult local_9e0;
  AssertHelper local_9d0;
  Message local_9c8;
  undefined4 local_9c0;
  undefined4 local_9bc;
  AssertionResult local_9b8;
  AssertHelper local_9a8;
  Message local_9a0;
  undefined4 local_994;
  AssertionResult local_990;
  string local_980;
  AssertHelper local_960;
  Message local_958;
  Script local_950;
  byte local_911;
  AssertionResult local_910;
  AssertHelper local_900;
  Message local_8f8;
  undefined4 local_8ec;
  AssertionResult local_8e8;
  string local_8d8;
  AssertHelper local_8b8;
  Message local_8b0;
  byte local_8a1;
  AssertionResult local_8a0;
  AssertHelper local_890;
  Message local_888;
  undefined4 local_87c;
  AssertionResult local_878;
  string local_868;
  AssertHelper local_848;
  Message local_840;
  byte local_831;
  AssertionResult local_830;
  undefined4 local_81c;
  AssertHelper local_818;
  Message local_810;
  string local_808 [32];
  AssertionResult local_7e8;
  undefined1 local_7d8 [376];
  AssertHelper local_660;
  Message local_658;
  string local_650 [32];
  AssertionResult local_630;
  AssertHelper local_620;
  Message local_618;
  string local_610 [32];
  AssertionResult local_5f0;
  allocator local_5d9;
  string local_5d8 [32];
  ConfidentialAssetId local_5b8;
  _func_int **local_590;
  undefined1 local_588;
  undefined1 local_580 [24];
  string local_568 [32];
  ConfidentialAssetId local_548;
  _func_int **local_520;
  undefined1 local_518;
  undefined1 local_510 [24];
  string local_4f8 [32];
  Txid local_4d8;
  OutPoint local_4b8;
  allocator local_489;
  string local_488 [32];
  Txid local_468;
  OutPoint local_448;
  uint local_420 [99];
  allocator local_291;
  string local_290 [32];
  ElementsConfidentialAddress local_270 [432];
  Script local_c0 [3];
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_c0,2,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_290,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3",
             &local_291);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_270,local_290);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_488,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_489
            );
  cfd::core::Txid::Txid(&local_468,local_488);
  cfd::core::OutPoint::OutPoint(&local_448,&local_468,2);
  cfd::core::Txid::~Txid((Txid *)0x1d3191);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4f8,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)(local_510 + 0x17));
  cfd::core::Txid::Txid(&local_4d8,local_4f8);
  cfd::core::OutPoint::OutPoint(&local_4b8,&local_4d8,0);
  cfd::ConfidentialTransactionContext::AddTxIn((OutPoint *)local_c0);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x1d3232);
  cfd::core::Txid::~Txid((Txid *)0x1d323f);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)(local_510 + 0x17));
  cfd::ConfidentialTransactionContext::AddTxIn((OutPoint *)local_c0);
  local_520 = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_518 = extraout_DL;
  local_510._0_8_ = local_520;
  local_510[8] = extraout_DL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_568,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)(local_580 + 0x17));
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_548,local_568);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            ((Amount *)local_c0,(ConfidentialAssetId *)local_510);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1d333d);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)(local_580 + 0x17));
  local_590 = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_588 = extraout_DL_00;
  local_580._0_8_ = local_590;
  local_580[8] = extraout_DL_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5d8,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_5d9
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_5b8,local_5d8);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ElementsConfidentialAddress *)local_c0,(Amount *)local_270,
             (ConfidentialAssetId *)local_580,SUB81(&local_5b8,0));
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1d3434);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_5f0,"txc.GetHex().c_str()",
             "\"020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000\""
             ,pcVar2,
             "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000"
            );
  std::__cxx11::string::~string(local_610);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f0);
  if (!bVar1) {
    testing::Message::Message(&local_618);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d377a);
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_620,&local_618);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    testing::Message::~Message((Message *)0x1d37dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3835);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_630,"addr.GetAddress().c_str()",
             "\"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz\"",pcVar2,"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz")
  ;
  std::__cxx11::string::~string(local_650);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_630);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d3922);
    testing::internal::AssertHelper::AssertHelper
              (&local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=(&local_660,&local_658);
    testing::internal::AssertHelper::~AssertHelper(&local_660);
    testing::Message::~Message((Message *)0x1d3985);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d39dd);
  cfd::ConfidentialTransactionContext::GetTxOutAddress((uint)local_7d8,(NetType)local_c0,true);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_7e8,"out1_addr.GetAddress().c_str()",
             "\"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz\"",pcVar2,"2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz")
  ;
  std::__cxx11::string::~string(local_808);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7e8);
  if (!bVar1) {
    testing::Message::Message(&local_810);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d3b07);
    testing::internal::AssertHelper::AssertHelper
              (&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(&local_818,&local_810);
    testing::internal::AssertHelper::~AssertHelper(&local_818);
    testing::Message::~Message((Message *)0x1d3b6a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3bc2);
  local_81c = 0;
  local_831 = cfd::ConfidentialTransactionContext::IsFindTxIn
                        ((OutPoint *)local_c0,(uint *)&local_448);
  local_831 = local_831 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,(type *)0x1d3c1c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_830);
  if (!bVar1) {
    testing::Message::Message(&local_840);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_868,(internal *)&local_830,
               (AssertionResult *)"txc.IsFindTxIn(outpoint, &index)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_848,&local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    std::__cxx11::string::~string((string *)&local_868);
    testing::Message::~Message((Message *)0x1d3d1a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3d92);
  local_87c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_878);
  if (!bVar1) {
    testing::Message::Message(&local_888);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d3e39);
    testing::internal::AssertHelper::AssertHelper
              (&local_890,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_890,&local_888);
    testing::internal::AssertHelper::~AssertHelper(&local_890);
    testing::Message::~Message((Message *)0x1d3e9c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d3ef4);
  local_8a1 = cfd::ConfidentialTransactionContext::IsFindTxOut
                        ((Address *)local_c0,local_420,(vector *)&local_81c);
  local_8a1 = local_8a1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,(type *)0x1d3f47);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8d8,(internal *)&local_8a0,(AssertionResult *)"txc.IsFindTxOut(addr, &index)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    std::__cxx11::string::~string((string *)&local_8d8);
    testing::Message::~Message((Message *)0x1d4045);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d40bd);
  local_8ec = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8e8);
  if (!bVar1) {
    testing::Message::Message(&local_8f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d4164);
    testing::internal::AssertHelper::AssertHelper
              (&local_900,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_900,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper(&local_900);
    testing::Message::~Message((Message *)0x1d41c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d421f);
  cfd::core::Script::Script(&local_950);
  local_911 = cfd::ConfidentialTransactionContext::IsFindTxOut
                        (local_c0,(uint *)&local_950,(vector *)&local_81c);
  local_911 = local_911 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,(type *)0x1d4281);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_910);
  if (!bVar1) {
    testing::Message::Message(&local_958);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_980,(internal *)&local_910,
               (AssertionResult *)"txc.IsFindTxOut(Script(), &index)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_960,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_960,&local_958);
    testing::internal::AssertHelper::~AssertHelper(&local_960);
    std::__cxx11::string::~string((string *)&local_980);
    testing::Message::~Message((Message *)0x1d43b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d442a);
  local_994 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_990);
  if (!bVar1) {
    testing::Message::Message(&local_9a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d44d1);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9a8,&local_9a0);
    testing::internal::AssertHelper::~AssertHelper(&local_9a8);
    testing::Message::~Message((Message *)0x1d4534);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d458c);
  local_9bc = cfd::ConfidentialTransactionContext::GetTxOutIndex((Address *)local_c0);
  local_9c0 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9b8);
  if (!bVar1) {
    testing::Message::Message(&local_9c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d465f);
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9d0,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    testing::Message::~Message((Message *)0x1d46c2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4717);
  local_9e1 = cfd::ConfidentialTransactionContext::IsFindFeeTxOut((uint *)local_c0);
  local_9e1 = local_9e1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,(type *)0x1d475e);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9e0);
  if (!bVar1) {
    testing::Message::Message(&local_9f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a18,(internal *)&local_9e0,(AssertionResult *)"txc.IsFindFeeTxOut(&index)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9f8,&local_9f0);
    testing::internal::AssertHelper::~AssertHelper(&local_9f8);
    std::__cxx11::string::~string((string *)&local_a18);
    testing::Message::~Message((Message *)0x1d485c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d48d4);
  local_a2c = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a28);
  if (!bVar1) {
    testing::Message::Message(&local_a38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d497b);
    testing::internal::AssertHelper::AssertHelper
              (&local_a40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a40,&local_a38);
    testing::internal::AssertHelper::~AssertHelper(&local_a40);
    testing::Message::~Message((Message *)0x1d49de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4a36);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_a68);
  local_aa0 = cfd::ConfidentialTransactionContext::GetFeeAmount((ConfidentialAssetId *)local_c0);
  local_a98 = extraout_DL_01;
  local_a90 = local_aa0;
  local_a88 = extraout_DL_01;
  local_a80 = cfd::core::Amount::GetSatoshiValue();
  local_aa4 = 0x1c84;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (long *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a78);
  if (!bVar1) {
    testing::Message::Message(&local_ab0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d4b8e);
    testing::internal::AssertHelper::AssertHelper
              (&local_ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ab8,&local_ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_ab8);
    testing::Message::~Message((Message *)0x1d4beb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4c43);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_ac8,"asset.GetHex().c_str()",
             "\"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225\"",pcVar2,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  std::__cxx11::string::~string((string *)&local_b08.version_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ac8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)
               ((long)&local_b08.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d4d2a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&local_b08.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&local_b08.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 8),
               (Message *)
               ((long)&local_b08.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0x10));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&local_b08.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 8));
    testing::Message::~Message((Message *)0x1d4d87);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4ddf);
  local_b18 = (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_b10 = extraout_DL_02;
  local_b08._vptr_ConfidentialAssetId = local_b18;
  local_b08.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = extraout_DL_02;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b60,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_b61
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_b40,local_b60);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ElementsConfidentialAddress *)local_c0,(Amount *)local_270,&local_b08,
             SUB81(&local_b40,0));
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1d4eaa);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator((allocator<char> *)&local_b61);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1d4ed6);
  local_b91 = cfd::ConfidentialTransactionContext::IsFindTxOut
                        ((Address *)local_c0,local_420,(vector *)&local_81c);
  local_b91 = local_b91 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
             in_stack_fffffffffffff228,(type *)0x1d4f24);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b90);
  if (!bVar1) {
    testing::Message::Message(&local_ba0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_bc8,(internal *)&local_b90,
               (AssertionResult *)"txc.IsFindTxOut(addr, &index, &indexes)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ba8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ba8,&local_ba0);
    testing::internal::AssertHelper::~AssertHelper(&local_ba8);
    std::__cxx11::string::~string((string *)&local_bc8);
    testing::Message::~Message((Message *)0x1d50a4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d511c);
  local_bdc = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             (uint *)in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bd8);
  if (!bVar1) {
    testing::Message::Message(&local_be8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d51bd);
    testing::internal::AssertHelper::AssertHelper
              (&local_bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bf0,&local_be8);
    testing::internal::AssertHelper::~AssertHelper(&local_bf0);
    testing::Message::~Message((Message *)0x1d521a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d526f);
  local_c08 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_b80);
  local_c0c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff248,
             (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
             in_stack_fffffffffffff238,
             (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c00);
  if (!bVar1) {
    testing::Message::Message(&local_c18);
    in_stack_fffffffffffff248 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1d5325);
    testing::internal::AssertHelper::AssertHelper
              (&local_c20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x7c,in_stack_fffffffffffff248);
    testing::internal::AssertHelper::operator=(&local_c20,&local_c18);
    testing::internal::AssertHelper::~AssertHelper(&local_c20);
    testing::Message::~Message((Message *)0x1d5382);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d53da);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_b80);
  if (sVar3 == 2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_b80,0);
    local_c34 = 1;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              (in_stack_fffffffffffff248,
               (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
               (uint *)in_stack_fffffffffffff238,
               (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
    in_stack_fffffffffffff247 = testing::AssertionResult::operator_cast_to_bool(&local_c30);
    if (!(bool)in_stack_fffffffffffff247) {
      testing::Message::Message(&local_c40);
      in_stack_fffffffffffff238 =
           (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0x1d549e);
      testing::internal::AssertHelper::AssertHelper
                (&local_c48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x7e,(char *)in_stack_fffffffffffff238);
      testing::internal::AssertHelper::operator=(&local_c48,&local_c40);
      testing::internal::AssertHelper::~AssertHelper(&local_c48);
      testing::Message::~Message((Message *)0x1d54fb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d5550);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_b80,1);
    local_c5c = 2;
    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
              (in_stack_fffffffffffff248,
               (char *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240),
               (uint *)in_stack_fffffffffffff238,
               (int *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
    in_stack_fffffffffffff237 = testing::AssertionResult::operator_cast_to_bool(&local_c58);
    if (!(bool)in_stack_fffffffffffff237) {
      testing::Message::Message(&local_c68);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d55fe);
      testing::internal::AssertHelper::AssertHelper
                (&local_c70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x7f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c70,&local_c68);
      testing::internal::AssertHelper::~AssertHelper(&local_c70);
      testing::Message::~Message((Message *)0x1d5659);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d56ae);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240));
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1d56d9);
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x1d56f3);
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)
             CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230));
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddTxInOut)
{
  ConfidentialTransactionContext txc(2, 0);
  ElementsConfidentialAddress ct_addr("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
  Address addr = ct_addr.GetUnblindedAddress();
  OutPoint outpoint = OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 2);
  txc.AddTxIn(OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0));
  txc.AddTxIn(outpoint);
  txc.AddTxOutFee(
      Amount::CreateBySatoshiAmount(7300),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

  EXPECT_STREQ(txc.GetHex().c_str(), "020000000002a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c8400000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000");
  EXPECT_STREQ(addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  Address out1_addr = txc.GetTxOutAddress(1, NetType::kElementsRegtest);
  EXPECT_STREQ(out1_addr.GetAddress().c_str(), "2deLw2MsbXTr44ZXKBS91midF2WzJPfQ8cz");

  uint32_t index = 0;
  EXPECT_TRUE(txc.IsFindTxIn(outpoint, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index));
  EXPECT_EQ(index, 1);
  EXPECT_TRUE(txc.IsFindTxOut(Script(), &index));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(txc.GetTxOutIndex(addr), 1);
  EXPECT_TRUE(txc.IsFindFeeTxOut(&index));
  EXPECT_EQ(index, 0);
  ConfidentialAssetId asset;
  EXPECT_EQ(txc.GetFeeAmount(&asset).GetSatoshiValue(), 7300);
  EXPECT_STREQ(asset.GetHex().c_str(), "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  txc.AddTxOut(
      ct_addr,
      Amount::CreateBySatoshiAmount(int64_t{209998999992700}),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  std::vector<uint32_t> indexes;
  EXPECT_TRUE(txc.IsFindTxOut(addr, &index, &indexes));
  EXPECT_EQ(index, 1);
  EXPECT_EQ(indexes.size(), 2);
  if (indexes.size() == 2) {
    EXPECT_EQ(indexes[0], 1);
    EXPECT_EQ(indexes[1], 2);
  }
}